

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_data__float4____glsl_float4
          (ColladaParserAutoGen14Private *this,ParserChar *text,size_t textLength)

{
  bool bVar1;
  floatDataFunctionPtr unaff_retaddr;
  
  bVar1 = GeneratedSaxParser::
          ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
          ::characterData2FloatData
                    (&this->
                      super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                     ,text,textLength,unaff_retaddr);
  return bVar1;
}

Assistant:

bool ColladaParserAutoGen14Private::_data__float4____glsl_float4( const ParserChar* text, size_t textLength )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
        float4____glsl_float4__ValidationData* validationData = (float4____glsl_float4__ValidationData*)mValidationDataStack.top();
        DISABLE_WARNING_UNUSED(validationData)
return characterData2FloatData(text, textLength, &ColladaParserAutoGen14::data__float4____glsl_float4, &validate__glsl_float4__stream, &validationData->validationWholeSize, 0);
    }
    else
    {
return characterData2FloatData(text, textLength, &ColladaParserAutoGen14::data__float4____glsl_float4);
    }
#else
    {
return characterData2FloatData(text, textLength, &ColladaParserAutoGen14::data__float4____glsl_float4);
    } // validation
#endif

}